

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  bool bVar1;
  bool bVar2;
  Result RVar3;
  bool bVar4;
  bool bVar5;
  uint8_t unknown_flags;
  bool is_64;
  bool is_shared;
  bool has_max;
  uint local_28;
  uint32_t max;
  uint32_t initial;
  uint8_t flags;
  Limits *out_page_limits_local;
  BinaryReader *this_local;
  
  _unknown_flags = 0;
  _initial = out_page_limits;
  out_page_limits_local = (Limits *)this;
  RVar3 = ReadU8(this,(uint8_t *)((long)&max + 3),"memory flags");
  bVar1 = Failed(RVar3);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = (max._3_1_ & 1) != 0;
    bVar4 = (max._3_1_ & 2) != 0;
    bVar5 = (max._3_1_ & 4) != 0;
    if ((max._3_1_ & 0xf8) == 0) {
      if ((!bVar4) || (bVar2 = Features::threads_enabled(&this->options_->features), bVar2)) {
        if ((!bVar5) || (bVar2 = Features::memory64_enabled(&this->options_->features), bVar2)) {
          RVar3 = ReadU32Leb128(this,&local_28,"memory initial page count");
          bVar2 = Failed(RVar3);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            if (bVar1) {
              RVar3 = ReadU32Leb128(this,(uint32_t *)&unknown_flags,"memory max page count");
              bVar2 = Failed(RVar3);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            _initial->has_max = bVar1;
            _initial->is_shared = bVar4;
            _initial->is_64 = bVar5;
            _initial->initial = (ulong)local_28;
            _initial->max = (ulong)_unknown_flags;
            std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::push_back
                      (&this->memories,_initial);
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
        else {
          PrintError(this,"memory64 not allowed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"memory may not be shared: threads not allowed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      PrintError(this,"malformed memory limits flag: %d",(ulong)max._3_1_);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint8_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  CHECK_RESULT(ReadU32Leb128(&initial, "memory initial page count"));
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "memory max page count"));
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  // Have to keep a copy of these, to know how to interpret load/stores.
  memories.push_back(*out_page_limits);
  return Result::Ok;
}